

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

void __thiscall TadsServerThread::thread_main(TadsServerThread *this)

{
  int iVar1;
  TadsListenerThread *in_RDI;
  bool bVar2;
  TadsListenerThread *unaff_retaddr;
  char *in_stack_00000008;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  TadsListenerThread *t;
  
  t = in_RDI;
  TadsListenerThread::add_thread
            (in_RDI,(TadsServerThread *)
                    CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  do {
    iVar1 = OS_Waitable::test((OS_Waitable *)0x25ee02);
    bVar2 = false;
    if (iVar1 == 0) {
      iVar1 = OS_Waitable::test((OS_Waitable *)0x25ee25);
      bVar2 = false;
      if (iVar1 == 0) {
        iVar1 = (*(in_RDI->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj.
                  _vptr_CVmRefCntObj[4])();
        bVar2 = iVar1 != 0;
      }
    }
  } while (bVar2);
  iVar1 = 0x3a9ded;
  set_run_state(this,in_stack_00000008);
  OS_CoreSocket::close((OS_CoreSocket *)in_RDI->password,iVar1);
  TadsListenerThread::remove_thread(unaff_retaddr,(TadsServerThread *)t);
  set_run_state(this,in_stack_00000008);
  return;
}

Assistant:

void TadsServerThread::thread_main()
{
    /* add this thread to the listener's active server list */
    listener->add_thread(this);

    /* process requests until we encounter an error or Quit signal */
    while (!listener->quit_evt->test()
           && !listener->shutdown_evt->test()
           && process_request()) ;

    /* terminating - close the socket */
    set_run_state("Closing");
    socket->close();

    /* remove myself from the listener's active server list */
    listener->remove_thread(this);

    /* set my final run state */
    set_run_state("Terminated");
}